

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdGetTaprootScriptTreeSrting(void *handle,void *tree_handle,char **tree_string)

{
  bool bVar1;
  reference this;
  reference this_00;
  char *pcVar2;
  undefined8 *in_RDX;
  long in_RSI;
  void *unaff_retaddr;
  CfdException *except;
  exception *std_except;
  string tree_str;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffee8;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *in_stack_fffffffffffffef0;
  string local_c8 [24];
  undefined8 in_stack_ffffffffffffff50;
  string local_a8;
  string local_88 [32];
  long local_68;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  undefined8 *local_20;
  long local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar3;
  
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer
            (unaff_retaddr,(string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  std::__cxx11::string::string(local_88);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_68 + 0x18));
  if (bVar1) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_c8,&this_00->super_TapBranch);
    std::__cxx11::string::operator=(local_88,local_c8);
    std::__cxx11::string::~string(local_c8);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                     (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_a8,this);
    std::__cxx11::string::operator=(local_88,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if (local_20 != (undefined8 *)0x0) {
    pcVar2 = cfd::capi::CreateString((string *)in_stack_ffffffffffffff50);
    *local_20 = pcVar2;
  }
  iVar3 = 0;
  std::__cxx11::string::~string(local_88);
  return iVar3;
}

Assistant:

int CfdGetTaprootScriptTreeSrting(
    void* handle, void* tree_handle, char** tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    std::string tree_str;
    if (!buffer->branch_buffer->empty()) {
      tree_str = buffer->branch_buffer->at(0).ToString();
    } else {
      tree_str = buffer->tree_buffer->at(0).ToString();
    }

    if (tree_string != nullptr) {
      *tree_string = CreateString(tree_str);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}